

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Win_allocate_shared
              (MPIABI_Aint size,int disp_unit,MPIABI_Info info,MPIABI_Comm comm,void *baseptr,
              MPIABI_Win *win)

{
  MPIABI_Win *pMVar1;
  int iVar2;
  ompi_info_t *poVar3;
  ompi_communicator_t *poVar4;
  ompi_win_t **ppoVar5;
  WPI_HandlePtr<ompi_win_t_*> local_50;
  WPI_Handle local_48 [8];
  WPI_Handle local_40 [8];
  MPIABI_Win *local_38;
  MPIABI_Win *win_local;
  void *baseptr_local;
  MPIABI_Comm comm_local;
  MPIABI_Info info_local;
  MPIABI_Aint MStack_10;
  int disp_unit_local;
  MPIABI_Aint size_local;
  
  local_38 = win;
  win_local = (MPIABI_Win *)baseptr;
  baseptr_local = (void *)comm;
  comm_local = info;
  info_local._4_4_ = disp_unit;
  MStack_10 = size;
  WPI_Handle<ompi_info_t_*>::WPI_Handle((WPI_Handle<ompi_info_t_*> *)local_40,info);
  poVar3 = WPI_Handle::operator_cast_to_ompi_info_t_(local_40);
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle
            ((WPI_Handle<ompi_communicator_t_*> *)local_48,(uintptr_t)baseptr_local);
  poVar4 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_48);
  pMVar1 = win_local;
  WPI_HandlePtr<ompi_win_t_*>::WPI_HandlePtr(&local_50,local_38);
  ppoVar5 = WPI_HandlePtr::operator_cast_to_ompi_win_t__((WPI_HandlePtr *)&local_50);
  iVar2 = MPI_Win_allocate_shared(size,disp_unit,poVar3,poVar4,pMVar1,ppoVar5);
  WPI_HandlePtr<ompi_win_t_*>::~WPI_HandlePtr(&local_50);
  return iVar2;
}

Assistant:

int MPIABI_Win_allocate_shared(
  MPIABI_Aint size,
  int disp_unit,
  MPIABI_Info info,
  MPIABI_Comm comm,
  void * baseptr,
  MPIABI_Win * win
) {
  return MPI_Win_allocate_shared(
    (MPI_Aint)(WPI_Aint)size,
    disp_unit,
    (MPI_Info)(WPI_Info)info,
    (MPI_Comm)(WPI_Comm)comm,
    baseptr,
    (MPI_Win *)(WPI_WinPtr)win
  );
}